

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<float>>(SquareMatrix<float> *mat)

{
  if (mat->size_ == 2) {
    print<float>(*(mat->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                  .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
    print<float>((mat->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl[mat->size_]);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    print<float>((mat->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl[1]);
    print<float>((mat->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl[mat->size_ + 1]);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  __assert_fail("mat.rows() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x61,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<float>]");
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }